

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall camp::EnumValueNotFound::~EnumValueNotFound(EnumValueNotFound *this)

{
  EnumValueNotFound *this_local;
  
  ~EnumValueNotFound(this);
  operator_delete(this);
  return;
}

Assistant:

class CAMP_API EnumValueNotFound : public Error
{
public:

    /**
     * \brief Constructor
     *
     * \param value Value of the requested metaenum member
     * \param enumName Name of the owner metaenum
     */
    EnumValueNotFound(long value, const std::string& enumName);
}